

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O0

void per_scan_setup(j_compress_ptr cinfo)

{
  long lVar1;
  long *in_RDI;
  long nominal;
  jpeg_component_info *compptr;
  int tmp;
  int mcublks;
  int ci;
  long local_30;
  uint local_14;
  int local_10;
  int local_c;
  
  if (*(int *)((long)in_RDI + 0x144) == 1) {
    lVar1 = in_RDI[0x29];
    *(undefined4 *)(in_RDI + 0x2d) = *(undefined4 *)(lVar1 + 0x1c);
    *(undefined4 *)((long)in_RDI + 0x16c) = *(undefined4 *)(lVar1 + 0x20);
    *(undefined4 *)(lVar1 + 0x34) = 1;
    *(undefined4 *)(lVar1 + 0x38) = 1;
    *(undefined4 *)(lVar1 + 0x3c) = 1;
    *(undefined4 *)(lVar1 + 0x40) = 8;
    *(undefined4 *)(lVar1 + 0x44) = 1;
    local_14 = *(uint *)(lVar1 + 0x20) % *(uint *)(lVar1 + 0xc);
    if (local_14 == 0) {
      local_14 = *(uint *)(lVar1 + 0xc);
    }
    *(uint *)(lVar1 + 0x48) = local_14;
    *(undefined4 *)(in_RDI + 0x2e) = 1;
    *(undefined4 *)((long)in_RDI + 0x174) = 0;
  }
  else {
    if ((*(int *)((long)in_RDI + 0x144) < 1) || (4 < *(int *)((long)in_RDI + 0x144))) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1a;
      *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x144);
      *(undefined4 *)(*in_RDI + 0x30) = 4;
      (**(code **)*in_RDI)(in_RDI);
    }
    lVar1 = jdiv_round_up((ulong)*(uint *)(in_RDI + 6),(long)((int)in_RDI[0x27] << 3));
    *(int *)(in_RDI + 0x2d) = (int)lVar1;
    lVar1 = jdiv_round_up((ulong)*(uint *)((long)in_RDI + 0x34),
                          (long)(*(int *)((long)in_RDI + 0x13c) << 3));
    *(int *)((long)in_RDI + 0x16c) = (int)lVar1;
    *(undefined4 *)(in_RDI + 0x2e) = 0;
    for (local_c = 0; local_c < *(int *)((long)in_RDI + 0x144); local_c = local_c + 1) {
      lVar1 = in_RDI[(long)local_c + 0x29];
      *(undefined4 *)(lVar1 + 0x34) = *(undefined4 *)(lVar1 + 8);
      *(undefined4 *)(lVar1 + 0x38) = *(undefined4 *)(lVar1 + 0xc);
      *(int *)(lVar1 + 0x3c) = *(int *)(lVar1 + 0x34) * *(int *)(lVar1 + 0x38);
      *(int *)(lVar1 + 0x40) = *(int *)(lVar1 + 0x34) << 3;
      local_14 = *(uint *)(lVar1 + 0x1c) % *(uint *)(lVar1 + 0x34);
      if (local_14 == 0) {
        local_14 = *(uint *)(lVar1 + 0x34);
      }
      *(uint *)(lVar1 + 0x44) = local_14;
      local_14 = *(uint *)(lVar1 + 0x20) % *(uint *)(lVar1 + 0x38);
      if (local_14 == 0) {
        local_14 = *(uint *)(lVar1 + 0x38);
      }
      *(uint *)(lVar1 + 0x48) = local_14;
      local_10 = *(int *)(lVar1 + 0x3c);
      if (10 < (int)in_RDI[0x2e] + local_10) {
        *(undefined4 *)(*in_RDI + 0x28) = 0xd;
        (**(code **)*in_RDI)(in_RDI);
      }
      while (0 < local_10) {
        lVar1 = in_RDI[0x2e];
        *(int *)(in_RDI + 0x2e) = (int)lVar1 + 1;
        *(int *)((long)in_RDI + (long)(int)lVar1 * 4 + 0x174) = local_c;
        local_10 = local_10 + -1;
      }
    }
  }
  if (0 < *(int *)((long)in_RDI + 0x11c)) {
    local_30 = (long)*(int *)((long)in_RDI + 0x11c) * (ulong)*(uint *)(in_RDI + 0x2d);
    if (0xfffe < local_30) {
      local_30 = 0xffff;
    }
    *(int *)(in_RDI + 0x23) = (int)local_30;
  }
  return;
}

Assistant:

LOCAL(void)
per_scan_setup(j_compress_ptr cinfo)
/* Do computations that are needed before processing a JPEG scan */
/* cinfo->comps_in_scan and cinfo->cur_comp_info[] are already set */
{
  int ci, mcublks, tmp;
  jpeg_component_info *compptr;

  if (cinfo->comps_in_scan == 1) {

    /* Noninterleaved (single-component) scan */
    compptr = cinfo->cur_comp_info[0];

    /* Overall image size in MCUs */
    cinfo->MCUs_per_row = compptr->width_in_blocks;
    cinfo->MCU_rows_in_scan = compptr->height_in_blocks;

    /* For noninterleaved scan, always one block per MCU */
    compptr->MCU_width = 1;
    compptr->MCU_height = 1;
    compptr->MCU_blocks = 1;
    compptr->MCU_sample_width = DCTSIZE;
    compptr->last_col_width = 1;
    /* For noninterleaved scans, it is convenient to define last_row_height
     * as the number of block rows present in the last iMCU row.
     */
    tmp = (int)(compptr->height_in_blocks % compptr->v_samp_factor);
    if (tmp == 0) tmp = compptr->v_samp_factor;
    compptr->last_row_height = tmp;

    /* Prepare array describing MCU composition */
    cinfo->blocks_in_MCU = 1;
    cinfo->MCU_membership[0] = 0;

  } else {

    /* Interleaved (multi-component) scan */
    if (cinfo->comps_in_scan <= 0 || cinfo->comps_in_scan > MAX_COMPS_IN_SCAN)
      ERREXIT2(cinfo, JERR_COMPONENT_COUNT, cinfo->comps_in_scan,
               MAX_COMPS_IN_SCAN);

    /* Overall image size in MCUs */
    cinfo->MCUs_per_row = (JDIMENSION)
      jdiv_round_up((long)cinfo->_jpeg_width,
                    (long)(cinfo->max_h_samp_factor * DCTSIZE));
    cinfo->MCU_rows_in_scan = (JDIMENSION)
      jdiv_round_up((long)cinfo->_jpeg_height,
                    (long)(cinfo->max_v_samp_factor * DCTSIZE));

    cinfo->blocks_in_MCU = 0;

    for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
      compptr = cinfo->cur_comp_info[ci];
      /* Sampling factors give # of blocks of component in each MCU */
      compptr->MCU_width = compptr->h_samp_factor;
      compptr->MCU_height = compptr->v_samp_factor;
      compptr->MCU_blocks = compptr->MCU_width * compptr->MCU_height;
      compptr->MCU_sample_width = compptr->MCU_width * DCTSIZE;
      /* Figure number of non-dummy blocks in last MCU column & row */
      tmp = (int)(compptr->width_in_blocks % compptr->MCU_width);
      if (tmp == 0) tmp = compptr->MCU_width;
      compptr->last_col_width = tmp;
      tmp = (int)(compptr->height_in_blocks % compptr->MCU_height);
      if (tmp == 0) tmp = compptr->MCU_height;
      compptr->last_row_height = tmp;
      /* Prepare array describing MCU composition */
      mcublks = compptr->MCU_blocks;
      if (cinfo->blocks_in_MCU + mcublks > C_MAX_BLOCKS_IN_MCU)
        ERREXIT(cinfo, JERR_BAD_MCU_SIZE);
      while (mcublks-- > 0) {
        cinfo->MCU_membership[cinfo->blocks_in_MCU++] = ci;
      }
    }

  }

  /* Convert restart specified in rows to actual MCU count. */
  /* Note that count must fit in 16 bits, so we provide limiting. */
  if (cinfo->restart_in_rows > 0) {
    long nominal = (long)cinfo->restart_in_rows * (long)cinfo->MCUs_per_row;
    cinfo->restart_interval = (unsigned int)MIN(nominal, 65535L);
  }
}